

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

string * __thiscall
testing::internal::
FormatForComparisonFailureMessage<TApp_EnumTest_Test::TestBody()::Level,TApp_EnumTest_Test::TestBody()::Level>
          (string *__return_storage_ptr__,internal *this,Level *value,Level *param_2)

{
  Level *param_1_local;
  Level *value_local;
  
  FormatForComparison<TApp_EnumTest_Test::TestBody()::Level,TApp_EnumTest_Test::TestBody()::Level>::
  Format_abi_cxx11_(__return_storage_ptr__,
                    (FormatForComparison<TApp_EnumTest_Test::TestBody()::Level,TApp_EnumTest_Test::TestBody()::Level>
                     *)this,value);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatForComparisonFailureMessage(
    const T1& value, const T2& /* other_operand */) {
  return FormatForComparison<T1, T2>::Format(value);
}